

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

bool vkt::pipeline::isSupportedSamplableFormat
               (InstanceInterface *instanceInterface,VkPhysicalDevice device,VkFormat format)

{
  bool bVar1;
  undefined1 local_110 [4];
  uint local_10c;
  VkFormatProperties formatProps;
  CompressedTexFormat compressedFormat;
  VkPhysicalDeviceFeatures physicalFeatures;
  VkFormat format_local;
  VkPhysicalDevice device_local;
  InstanceInterface *instanceInterface_local;
  
  bVar1 = ::vk::isCompressedFormat(format);
  if (bVar1) {
    formatProps.optimalTilingFeatures = ::vk::mapVkCompressedFormat(format);
    (*instanceInterface->_vptr_InstanceInterface[2])
              (instanceInterface,device,&formatProps.bufferFeatures);
    bVar1 = tcu::isAstcFormat(formatProps.optimalTilingFeatures);
    if (bVar1) {
      if (physicalFeatures.samplerAnisotropy == 0) {
        return false;
      }
    }
    else {
      bVar1 = tcu::isEtcFormat(formatProps.optimalTilingFeatures);
      if ((bVar1) && (physicalFeatures.multiViewport == 0)) {
        return false;
      }
    }
  }
  (*instanceInterface->_vptr_InstanceInterface[3])(instanceInterface,device,(ulong)format,local_110)
  ;
  return (local_10c & 1) != 0;
}

Assistant:

bool isSupportedSamplableFormat (const InstanceInterface& instanceInterface, VkPhysicalDevice device, VkFormat format)
{
	if (isCompressedFormat(format))
	{
		VkPhysicalDeviceFeatures		physicalFeatures;
		const tcu::CompressedTexFormat	compressedFormat	= mapVkCompressedFormat(format);

		instanceInterface.getPhysicalDeviceFeatures(device, &physicalFeatures);

		if (tcu::isAstcFormat(compressedFormat))
		{
			if (!physicalFeatures.textureCompressionASTC_LDR)
				return false;
		}
		else if (tcu::isEtcFormat(compressedFormat))
		{
			if (!physicalFeatures.textureCompressionETC2)
				return false;
		}
		else
		{
			DE_FATAL("Unsupported compressed format");
		}
	}

	VkFormatProperties	formatProps;
	instanceInterface.getPhysicalDeviceFormatProperties(device, format, &formatProps);

	return (formatProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0u;
}